

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O3

int mriStep_SetNonlinRDiv(ARKodeMem ark_mem,sunrealtype rdiv)

{
  int iVar1;
  ARKodeMRIStepMem step_mem;
  ARKodeMRIStepMem local_20;
  double local_18;
  
  local_18 = rdiv;
  iVar1 = mriStep_AccessStepMem(ark_mem,"mriStep_SetNonlinRDiv",&local_20);
  if (iVar1 == 0) {
    local_20->rdiv =
         (sunrealtype)
         (~-(ulong)(0.0 < local_18) & 0x4002666666666666 |
         (ulong)local_18 & -(ulong)(0.0 < local_18));
  }
  return iVar1;
}

Assistant:

int mriStep_SetNonlinRDiv(ARKodeMem ark_mem, sunrealtype rdiv)
{
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* if argument legal set it, otherwise set default */
  if (rdiv <= ZERO) { step_mem->rdiv = RDIV; }
  else { step_mem->rdiv = rdiv; }

  return (ARK_SUCCESS);
}